

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O1

void Assimp::ExportAssimp2Json(char *file,IOSystem *io,aiScene *scene,ExportProperties *param_4)

{
  int iVar1;
  undefined4 extraout_var;
  aiScene *scenecopy_tmp;
  MeshSplitter splitter;
  JSONWriter s;
  aiScene *local_1f8;
  MeshSplitter local_1ec;
  JSONWriter local_1e8;
  IOStream *out;
  
  iVar1 = (*io->_vptr_IOSystem[4])(io,file,"wt");
  out = (IOStream *)CONCAT44(extraout_var,iVar1);
  aiCopyScene(scene,&local_1f8);
  local_1ec.LIMIT = 0x10000;
  MeshSplitter::Execute(&local_1ec,local_1f8);
  JSONWriter::JSONWriter(&local_1e8,out,2);
  Write(&local_1e8,local_1f8);
  JSONWriter::~JSONWriter(&local_1e8);
  aiFreeScene(local_1f8);
  (*out->_vptr_IOStream[1])(out);
  return;
}

Assistant:

void ExportAssimp2Json(const char* file, Assimp::IOSystem* io, const aiScene* scene, const Assimp::ExportProperties*) {
    std::unique_ptr<Assimp::IOStream> str(io->Open(file, "wt"));
    if (!str) {
        //throw Assimp::DeadlyExportError("could not open output file");
    }

    // get a copy of the scene so we can modify it
    aiScene* scenecopy_tmp;
    aiCopyScene(scene, &scenecopy_tmp);

    try {
        // split meshes so they fit into a 16 bit index buffer
        MeshSplitter splitter;
        splitter.SetLimit(1 << 16);
        splitter.Execute(scenecopy_tmp);

        // XXX Flag_WriteSpecialFloats is turned on by default, right now we don't have a configuration interface for exporters
        JSONWriter s(*str, JSONWriter::Flag_WriteSpecialFloats);
        Write(s, *scenecopy_tmp);

    }
    catch (...) {
        aiFreeScene(scenecopy_tmp);
        throw;
    }
    aiFreeScene(scenecopy_tmp);
}